

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       *this,ostream *o,bool pretty_print,uint indent_step,uint current_indent)

{
  ostream *poVar1;
  array_t *paVar2;
  object_t *poVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  string_t *this_00;
  pointer this_01;
  allocator local_a9;
  char *local_a8;
  uint local_9c;
  numtostr local_98;
  char *local_58;
  string_t local_50;
  
  if (discarded < this->m_type) {
    return;
  }
  switch(this->m_type) {
  case null:
    pcVar5 = "null";
    break;
  case object:
    if ((((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pcVar5 = "{}";
      break;
    }
    local_9c = (uint)pretty_print;
    std::operator<<(o,"{");
    if (pretty_print) {
      current_indent = current_indent + indent_step;
      std::operator<<(o,"\n");
      local_58 = ",\n";
      local_a8 = " ";
    }
    else {
      local_58 = ",";
      local_a8 = "";
    }
    poVar3 = (this->m_value).object;
    p_Var4 = (poVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(poVar3->_M_t)._M_impl.super__Rb_tree_header) {
      if (p_Var4 != (poVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        std::operator<<(o,local_58);
      }
      local_98.m_buf._M_elems._0_8_ = local_98.m_buf._M_elems + 0x10;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)current_indent);
      poVar1 = std::operator<<(o,(string *)&local_98);
      poVar1 = std::operator<<(poVar1,"\"");
      escape_string(&local_50,(string_t *)(p_Var4 + 1));
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      poVar1 = std::operator<<(poVar1,"\":");
      std::operator<<(poVar1,local_a8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)(p_Var4 + 2),o,SUB41(local_9c,0),indent_step,current_indent);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      poVar3 = (this->m_value).object;
    }
    if (pretty_print) {
      current_indent = current_indent - indent_step;
      std::operator<<(o,"\n");
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)current_indent);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   &local_50,"}");
    std::operator<<(o,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    this_00 = &local_50;
    goto LAB_00114cca;
  case array:
    if ((((this->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (((this->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = "[]";
      break;
    }
    std::operator<<(o,"[");
    if (pretty_print) {
      current_indent = current_indent + indent_step;
      std::operator<<(o,"\n");
      local_a8 = ",\n";
    }
    else {
      local_a8 = ",";
    }
    paVar2 = (this->m_value).array;
    for (this_01 = (paVar2->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        (paVar2->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      if (this_01 !=
          (paVar2->
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(o,local_a8);
      }
      local_98.m_buf._M_elems._0_8_ = local_98.m_buf._M_elems + 0x10;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)current_indent);
      std::operator<<(o,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      dump(this_01,o,pretty_print,indent_step,current_indent);
      paVar2 = (this->m_value).array;
    }
    if (pretty_print) {
      current_indent = current_indent - indent_step;
      std::operator<<(o,"\n");
    }
    local_98.m_buf._M_elems._0_8_ = local_98.m_buf._M_elems + 0x10;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)current_indent);
    poVar1 = std::operator<<(o,(string *)&local_98);
    std::operator<<(poVar1,"]");
    goto LAB_00114b68;
  case string:
    std::__cxx11::string::string((string *)&local_98,"\"",&local_a9);
    poVar1 = std::operator<<(o,(string *)&local_98);
    escape_string(&local_50,(this->m_value).string);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&local_50);
LAB_00114b68:
    this_00 = (string_t *)&local_98;
LAB_00114cca:
    std::__cxx11::string::~string((string *)this_00);
    return;
  case boolean:
    pcVar5 = "false";
    if ((this->m_value).boolean != false) {
      pcVar5 = "true";
    }
    break;
  case number_integer:
    numtostr::numtostr<long>(&local_98,(this->m_value).number_integer);
    goto LAB_00114a5a;
  case number_unsigned:
    numtostr::numtostr<unsigned_long>(&local_98,(this->m_value).number_unsigned);
    goto LAB_00114a5a;
  case number_float:
    numtostr::numtostr<double>(&local_98,(this->m_value).number_float);
LAB_00114a5a:
    std::operator<<(o,(char *)&local_98);
    return;
  case discarded:
    pcVar5 = "<discarded>";
  }
  std::operator<<(o,pcVar5);
  return;
}

Assistant:

void dump(std::ostream& o,
              const bool pretty_print,
              const unsigned int indent_step,
              const unsigned int current_indent = 0) const
    {
        // variable to hold indentation for recursive calls
        unsigned int new_indent = current_indent;

        switch (m_type)
        {
            case value_t::object:
            {
                if (m_value.object->empty())
                {
                    o << "{}";
                    return;
                }

                o << "{";

                // increase indentation
                if (pretty_print)
                {
                    new_indent += indent_step;
                    o << "\n";
                }

                for (auto i = m_value.object->cbegin(); i != m_value.object->cend(); ++i)
                {
                    if (i != m_value.object->cbegin())
                    {
                        o << (pretty_print ? ",\n" : ",");
                    }
                    o << string_t(new_indent, ' ') << "\""
                      << escape_string(i->first) << "\":"
                      << (pretty_print ? " " : "");
                    i->second.dump(o, pretty_print, indent_step, new_indent);
                }

                // decrease indentation
                if (pretty_print)
                {
                    new_indent -= indent_step;
                    o << "\n";
                }

                o << string_t(new_indent, ' ') + "}";
                return;
            }

            case value_t::array:
            {
                if (m_value.array->empty())
                {
                    o << "[]";
                    return;
                }

                o << "[";

                // increase indentation
                if (pretty_print)
                {
                    new_indent += indent_step;
                    o << "\n";
                }

                for (auto i = m_value.array->cbegin(); i != m_value.array->cend(); ++i)
                {
                    if (i != m_value.array->cbegin())
                    {
                        o << (pretty_print ? ",\n" : ",");
                    }
                    o << string_t(new_indent, ' ');
                    i->dump(o, pretty_print, indent_step, new_indent);
                }

                // decrease indentation
                if (pretty_print)
                {
                    new_indent -= indent_step;
                    o << "\n";
                }

                o << string_t(new_indent, ' ') << "]";
                return;
            }

            case value_t::string:
            {
                o << string_t("\"") << escape_string(*m_value.string) << "\"";
                return;
            }

            case value_t::boolean:
            {
                o << (m_value.boolean ? "true" : "false");
                return;
            }

            case value_t::number_integer:
            {
                o << numtostr(m_value.number_integer).c_str();
                return;
            }

            case value_t::number_unsigned:
            {
                o << numtostr(m_value.number_unsigned).c_str();
                return;
            }

            case value_t::number_float:
            {
                o << numtostr(m_value.number_float).c_str();
                return;
            }

            case value_t::discarded:
            {
                o << "<discarded>";
                return;
            }

            case value_t::null:
            {
                o << "null";
                return;
            }
        }
    }